

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  pointer pcVar1;
  pointer ppcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  string *psVar5;
  ostream *poVar6;
  PolicyID id;
  PolicyID id_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  string msg_1;
  string currentStartFile;
  string currentStart;
  ostringstream e;
  string local_1f0;
  string local_1d0;
  long *local_1b0;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *local_1a8;
  long local_1a0 [2];
  undefined1 local_190 [16];
  cmState *local_180;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *local_178;
  long *local_170;
  undefined8 local_168;
  ios_base local_120 [264];
  
  InitializeFromParent(mf,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_190,&mf->StateSnapshot);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_190);
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar1,pcVar1 + psVar5->_M_string_length);
  if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    local_190._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x18;
    local_190._8_8_ = "   Entering             ";
    local_180 = (cmState *)0x0;
    local_178 = local_1a8;
    local_170 = local_1b0;
    local_168 = 0;
    views._M_len = 2;
    views._M_array = (iterator)local_190;
    cmCatViews(&local_1d0,views);
    cmSystemTools::Message(&local_1d0,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
  }
  local_190._0_8_ = local_1a8;
  local_190._8_8_ = local_1b0;
  local_180 = (cmState *)0x0;
  local_178 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0xf;
  local_170 = (long *)0x89aa7b;
  local_168 = 0;
  views_00._M_len = 2;
  views_00._M_array = (iterator)local_190;
  cmCatViews(&local_1d0,views_00);
  bVar3 = cmsys::SystemTools::FileExists(&local_1d0,true);
  if (bVar3) {
    Configure(mf);
    if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_190,&this->StateSnapshot);
      psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_190);
      local_190._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x18;
      local_190._8_8_ = "   Returning to         ";
      local_180 = (cmState *)0x0;
      local_170 = (long *)(psVar5->_M_dataplus)._M_p;
      local_178 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                  psVar5->_M_string_length;
      local_168 = 0;
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_190;
      cmCatViews(&local_1f0,views_01);
      cmSystemTools::Message(&local_1f0,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
    }
    goto LAB_002faf3c;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"The source directory\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"  ",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)local_1b0,(long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"does not contain a CMakeLists.txt file.",0x27);
  PVar4 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0014,false);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1f0,(cmPolicies *)0xe,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
LAB_002faeb8:
    std::__cxx11::stringbuf::str();
    ppcVar2 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar2) {
      ppcVar2[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_1f0,&this->Backtrace
                       );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_002faf11:
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  else if (PVar4 == WARN) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"CMake does not support this case but it used ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"to work accidentally and is being allowed for ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"compatibility.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f0,(cmPolicies *)0xe,id_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1f0,
                        &this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_002faf11;
  }
  else if (PVar4 == NEW) goto LAB_002faeb8;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
LAB_002faf3c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = cmStrCat("   Entering             ", currentStart);
    cmSystemTools::Message(msg);
  }

  std::string const currentStartFile =
    cmStrCat(currentStart, "/CMakeLists.txt");
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(MessageType::FATAL_ERROR, e.str());
        break;
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg =
      cmStrCat("   Returning to         ", this->GetCurrentSourceDirectory());
    cmSystemTools::Message(msg);
  }
}